

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

uint32_t upb_MiniTable_GetSubList(upb_MiniTable *m,upb_MiniTableField **subs)

{
  _Bool _Var1;
  int iVar2;
  upb_CType uVar3;
  upb_MiniTableField *puVar4;
  upb_MiniTableField *f_1;
  int i_1;
  upb_MiniTableField *f;
  uint local_20;
  int i;
  uint32_t enum_count;
  uint32_t msg_count;
  upb_MiniTableField **subs_local;
  upb_MiniTable *m_local;
  
  i = 0;
  local_20 = 0;
  _enum_count = subs;
  for (f._4_4_ = 0; iVar2 = upb_MiniTable_FieldCount(m), (int)f._4_4_ < iVar2; f._4_4_ = f._4_4_ + 1
      ) {
    puVar4 = upb_MiniTable_GetFieldByIndex(m,f._4_4_);
    uVar3 = upb_MiniTableField_CType(puVar4);
    if (uVar3 == kUpb_CType_Message) {
      *_enum_count = puVar4;
      _enum_count = _enum_count + 1;
      i = i + 1;
    }
  }
  for (f_1._4_4_ = 0; iVar2 = upb_MiniTable_FieldCount(m), (int)f_1._4_4_ < iVar2;
      f_1._4_4_ = f_1._4_4_ + 1) {
    puVar4 = upb_MiniTable_GetFieldByIndex(m,f_1._4_4_);
    _Var1 = upb_MiniTableField_IsClosedEnum(puVar4);
    if (_Var1) {
      *_enum_count = puVar4;
      _enum_count = _enum_count + 1;
      local_20 = local_20 + 1;
    }
  }
  return i << 0x10 | local_20;
}

Assistant:

uint32_t upb_MiniTable_GetSubList(const upb_MiniTable* m,
                                  const upb_MiniTableField** subs) {
  uint32_t msg_count = 0;
  uint32_t enum_count = 0;

  for (int i = 0; i < upb_MiniTable_FieldCount(m); i++) {
    const upb_MiniTableField* f = upb_MiniTable_GetFieldByIndex(m, i);
    if (upb_MiniTableField_CType(f) == kUpb_CType_Message) {
      *subs = f;
      ++subs;
      msg_count++;
    }
  }

  for (int i = 0; i < upb_MiniTable_FieldCount(m); i++) {
    const upb_MiniTableField* f = upb_MiniTable_GetFieldByIndex(m, i);
    if (upb_MiniTableField_IsClosedEnum(f)) {
      *subs = f;
      ++subs;
      enum_count++;
    }
  }

  return (msg_count << 16) | enum_count;
}